

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<long_double>_>::Decompose_Cholesky
          (TPZMatrix<std::complex<long_double>_> *this,list<long,_std::allocator<long>_> *singular)

{
  complex<long_double> a;
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  undefined4 extraout_var;
  TPZBaseMatrix *in_RDI;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  complex<long_double> tmp2;
  int64_t k_1;
  int64_t j;
  complex<long_double> tmp;
  int64_t k;
  int64_t i;
  int64_t dim;
  complex<long_double> *in_stack_fffffffffffffc88;
  undefined2 in_stack_fffffffffffffc90;
  undefined6 in_stack_fffffffffffffc92;
  value_type_conflict5 *__x;
  undefined2 uVar8;
  undefined6 uVar9;
  long in_stack_fffffffffffffcd0;
  long in_stack_fffffffffffffcd8;
  long in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 uVar10;
  undefined6 uVar11;
  undefined2 in_stack_fffffffffffffcf6;
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  complex<long_double> *local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  complex<long_double> *local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined1 local_228 [32];
  undefined1 local_208 [64];
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [32];
  long local_188;
  long local_180;
  char *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  undefined1 local_158 [32];
  complex<long_double> local_138;
  complex<long_double> *local_118 [2];
  value_type_conflict5 *local_108;
  undefined8 uStack_100;
  double local_f8 [4];
  undefined1 local_d8 [32];
  undefined1 local_b8 [64];
  undefined1 local_78 [32];
  undefined1 local_58 [40];
  long local_30;
  long local_28;
  long local_20;
  
  if ((in_RDI->fDecomposed != '\0') && (in_RDI->fDecomposed != '\x03')) {
    Error(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  if (in_RDI->fDecomposed == '\0') {
    iVar5 = TPZBaseMatrix::Rows(in_RDI);
    iVar6 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar5 != iVar6) {
      Error(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])();
    local_20 = CONCAT44(extraout_var,iVar4);
    for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
      lVar7 = in_ST1;
      in_ST1 = in_ST3;
      in_ST3 = in_ST5;
      for (local_30 = 0; lVar1 = local_28, local_30 < local_28; local_30 = local_30 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_78,in_RDI,local_28,local_28);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_b8,in_RDI,local_28,local_30);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_d8,in_RDI,local_28,local_30);
        std::operator*((complex<long_double> *)
                       CONCAT62(in_stack_fffffffffffffc92,in_stack_fffffffffffffc90),
                       in_stack_fffffffffffffc88);
        std::operator-((complex<long_double> *)
                       CONCAT62(in_stack_fffffffffffffc92,in_stack_fffffffffffffc90),
                       in_stack_fffffffffffffc88);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar1,lVar1,local_58);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_f8,in_RDI,local_28);
      fabs(local_f8[0]);
      uVar10 = SUB104(in_ST0,0);
      uVar11 = (undefined6)((unkuint10)in_ST0 >> 0x20);
      std::complex<long_double>::complex
                ((complex<long_double> *)local_118,(longdouble)1e-12,(longdouble)0);
      uVar8 = (undefined2)uStack_100;
      uVar9 = SUB86(uStack_100,2);
      in_stack_fffffffffffffc90 = SUB82(local_118[1],0);
      in_stack_fffffffffffffc92 = (undefined6)((ulong)local_118[1] >> 0x10);
      in_ST0 = in_ST2;
      in_ST2 = in_ST4;
      in_ST4 = in_ST6;
      in_stack_fffffffffffffc88 = local_118[0];
      __x = local_108;
      fabs((double)local_118[0]);
      in_ST5 = in_ST4;
      in_ST6 = in_ST4;
      if ((longdouble)CONCAT64(uVar11,uVar10) <= lVar7) {
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  ((list<long,_std::allocator<long>_> *)CONCAT62(uVar9,uVar8),__x);
        lVar7 = (longdouble)1;
        in_stack_fffffffffffffc88 = SUB108(lVar7,0);
        in_stack_fffffffffffffc90 = (undefined2)((unkuint10)lVar7 >> 0x40);
        in_stack_fffffffffffffcd8 = local_28;
        in_stack_fffffffffffffce0 = local_28;
        std::complex<long_double>::complex(&local_138,lVar7,(longdouble)0);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0,&local_138);
      }
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])
                (&stack0xfffffffffffffe88,in_RDI,local_28,local_28);
      std::sqrt<long_double>((complex<long_double> *)CONCAT26(in_stack_fffffffffffffcf6,uVar11));
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_28,local_28,local_158);
      local_180 = local_28;
      while (local_180 = local_180 + 1, local_180 < local_20) {
        for (local_188 = 0; lVar1 = local_28, local_188 < local_28; local_188 = local_188 + 1) {
          in_stack_fffffffffffffcd0 = local_180;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_1c8,in_RDI,local_28,local_180);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_208,in_RDI,local_28,local_188);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_228,in_RDI,local_188,local_180)
          ;
          std::operator*((complex<long_double> *)
                         CONCAT62(in_stack_fffffffffffffc92,in_stack_fffffffffffffc90),
                         in_stack_fffffffffffffc88);
          std::operator-((complex<long_double> *)
                         CONCAT62(in_stack_fffffffffffffc92,in_stack_fffffffffffffc90),
                         in_stack_fffffffffffffc88);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                    (in_RDI,lVar1,in_stack_fffffffffffffcd0,local_1a8);
        }
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(&local_248,in_RDI,local_28,local_28);
        local_268 = local_248;
        local_260 = local_240;
        local_258 = local_238;
        local_250 = local_230;
        in_stack_fffffffffffffc90 = (undefined2)local_240;
        in_stack_fffffffffffffc92 = (undefined6)((ulong)local_240 >> 0x10);
        a._M_value._8_8_ = in_stack_fffffffffffffcd8;
        a._M_value._0_8_ = in_stack_fffffffffffffcd0;
        a._M_value._16_8_ = in_stack_fffffffffffffce0;
        a._M_value._24_4_ = in_stack_fffffffffffffce8;
        a._M_value._28_4_ = uVar10;
        in_stack_fffffffffffffc88 = local_248;
        bVar3 = IsZero(a);
        if (bVar3) {
          Error(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        }
        lVar2 = local_28;
        lVar1 = local_180;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_2a8,in_RDI,local_28,local_180);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_2c8,in_RDI,local_28,local_28);
        std::operator/((complex<long_double> *)
                       CONCAT62(in_stack_fffffffffffffc92,in_stack_fffffffffffffc90),
                       in_stack_fffffffffffffc88);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar2,lVar1,local_288);
        lVar2 = local_28;
        lVar1 = local_180;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_2e8,in_RDI,local_28,local_180);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar1,lVar2,local_2e8);
      }
    }
    in_RDI->fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular) {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {             //elementos da diagonal
			PutVal( i,i,GetVal(i,i)-GetVal(i,k)*GetVal(i,k) );
		}
		if((fabs(GetVal(i,i))) <= fabs((TVar)1.e-12))
		{
			singular.push_back(i);
			PutVal(i,i,1.);
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {           //elementos fora da diagonal
            for(int64_t k=0; k<i; k++) {
                PutVal( i,j,GetVal(i,j)-GetVal(i,k)*GetVal(k,j) );
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            PutVal(j,i,GetVal(i,j));
			
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
}